

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

int __thiscall RenX::Server::kill(Server *this,__pid_t __pid,int __sig)

{
  ssize_t sVar1;
  ulong uVar2;
  undefined7 uVar3;
  undefined7 extraout_var;
  size_t __n;
  int in_R8D;
  bool bVar4;
  bool local_65;
  string local_50;
  __sv_type local_30;
  __pid_t local_1c;
  Server *pSStack_18;
  int id_local;
  Server *this_local;
  
  __n = (ulong)this->m_competitive & 1;
  uVar2 = 0;
  bVar4 = (int)__n == 0;
  local_65 = false;
  local_1c = __pid;
  pSStack_18 = this;
  if (bVar4) {
    string_printf_abi_cxx11_(&local_50,"kill pid%d",(ulong)(uint)__pid);
    local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
    sVar1 = send(this,(int)local_30._M_len,local_30._M_str,__n,in_R8D);
    local_65 = 0 < (int)sVar1;
    uVar2 = (ulong)CONCAT31((int3)((ulong)sVar1 >> 8),local_65);
  }
  uVar3 = (undefined7)(uVar2 >> 8);
  this_local._7_1_ = local_65;
  if (bVar4) {
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = extraout_var;
  }
  return (uint)CONCAT71(uVar3,this_local._7_1_) & 0xffffff01;
}

Assistant:

bool RenX::Server::kill(int id) {
	return m_competitive == false && send(string_printf("kill pid%d", id)) > 0;
}